

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O3

void Gia_ManMinCex(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  lit *begin;
  bool bVar1;
  sat_solver *psVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Abc_Cex_t *p_00;
  Vec_Int_t *pVVar6;
  int *piVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  timespec ts;
  int iLit;
  timespec local_68;
  Vec_Int_t *local_58;
  sat_solver *local_50;
  lit local_44;
  Cnf_Dat_t *local_40;
  Gia_Man_t *local_38;
  
  clock_gettime(3,&local_68);
  iVar4 = clock_gettime(3,&local_68);
  if (iVar4 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  p_00 = Bmc_CexCareMinimizeAig(p,p->vCis->nSize - p->nRegs,pCex,1,1,1);
  uVar8 = p_00->nRegs;
  uVar10 = 0;
  if ((int)uVar8 < p_00->nBits) {
    uVar10 = 0;
    do {
      uVar10 = uVar10 + (((uint)(&p_00[1].iPo)[(int)uVar8 >> 5] >> (uVar8 & 0x1f) & 1) != 0);
      uVar8 = uVar8 + 1;
    } while (p_00->nBits != uVar8);
  }
  Abc_CexFree(p_00);
  printf("Care bits = %d. ",(ulong)uVar10);
  iVar5 = 3;
  iVar4 = clock_gettime(3,&local_68);
  if (iVar4 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  Abc_Print(iVar5,"%s =","CEX minimization");
  Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar13 + lVar9) / 1000000.0);
  iVar4 = clock_gettime(3,&local_68);
  if (iVar4 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  local_38 = Gia_ManFramesForCexMin(p,pCex->iFrame + 1);
  local_40 = (Cnf_Dat_t *)Mf_ManGenerateCnf(local_38,8,0,0,0,0);
  iVar4 = local_40->nVars;
  iVar12 = ~pCex->iFrame * pCex->nPis;
  local_50 = (sat_solver *)Cnf_DataWriteIntoSolver(local_40,1,0);
  local_44 = 3;
  iVar5 = sat_solver_addclause(local_50,&local_44,(lit *)&local_40);
  if (iVar5 != 0) {
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 100;
    pVVar6->nSize = 0;
    piVar7 = (int *)malloc(400);
    pVVar6->pArray = piVar7;
    uVar8 = pCex->nRegs;
    local_58 = pVVar6;
    if ((int)uVar8 < pCex->nBits) {
      iVar5 = (iVar4 + uVar8 + iVar12) * 2;
      do {
        if ((int)((uVar8 + iVar12 + iVar4) - pCex->nRegs) < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntPush(local_58,iVar5 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar8 >> 5] >> (uVar8 & 0x1f)
                                            & 1) != 0) + pCex->nRegs * -2 ^ 1);
        uVar8 = uVar8 + 1;
        iVar5 = iVar5 + 2;
      } while ((int)uVar8 < pCex->nBits);
    }
    iVar5 = 3;
    iVar4 = clock_gettime(3,&local_68);
    if (iVar4 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
    }
    Abc_Print(iVar5,"%s =","SAT solver");
    Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar13 + lVar9) / 1000000.0);
    bVar3 = true;
    do {
      bVar1 = bVar3;
      if ((!bVar1) && (uVar8 = local_58->nSize, 1 < (int)uVar8)) {
        piVar7 = local_58->pArray;
        uVar10 = uVar8 >> 1;
        uVar11 = 0;
        do {
          uVar8 = uVar8 - 1;
          iVar4 = piVar7[uVar11];
          piVar7[uVar11] = piVar7[(int)uVar8];
          piVar7[(int)uVar8] = iVar4;
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      iVar4 = clock_gettime(3,&local_68);
      psVar2 = local_50;
      if (iVar4 < 0) {
        lVar9 = 1;
      }
      else {
        lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
        lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_68.tv_sec * -1000000;
      }
      begin = local_58->pArray;
      iVar4 = local_58->nSize;
      uVar8 = sat_solver_solve(local_50,begin,begin + iVar4,0,0,0,0);
      printf("Status %d.  Selected %d assumptions out of %d.  ",(ulong)uVar8,
             (ulong)(uint)(psVar2->conf_final).size);
      iVar12 = 3;
      iVar5 = clock_gettime(3,&local_68);
      if (iVar5 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      Abc_Print(iVar12,"%s =","Analyze_final");
      Abc_Print(iVar12,"%9.2f sec\n",(double)(lVar13 + lVar9) / 1000000.0);
      iVar5 = clock_gettime(3,&local_68);
      if (iVar5 < 0) {
        lVar9 = 1;
      }
      else {
        lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
        lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_68.tv_sec * -1000000;
      }
      uVar10 = sat_solver_minimize_assumptions(local_50,begin,iVar4,0);
      printf("Status %d.  Selected %d assumptions out of %d.  ",(ulong)uVar8,(ulong)uVar10);
      iVar5 = 3;
      iVar4 = clock_gettime(3,&local_68);
      if (iVar4 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      Abc_Print(iVar5,"%s =","LEXUNSAT");
      Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar13 + lVar9) / 1000000.0);
      bVar3 = false;
    } while (bVar1);
    if (begin != (lit *)0x0) {
      free(begin);
    }
    free(local_58);
    sat_solver_delete(local_50);
    Cnf_DataFree(local_40);
    Gia_ManStop(local_38);
    return;
  }
  __assert_fail("status",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCex.c"
                ,0x1d6,"void Gia_ManMinCex(Gia_Man_t *, Abc_Cex_t *)");
}

Assistant:

void Gia_ManMinCex( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    abctime clk = Abc_Clock();
    int n, i, iFirstVar, iLit, status, Counter = 0;//, Id;
    Vec_Int_t * vLits;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    int nFinal, * pFinal;
    Abc_Cex_t * pCexCare;
    Gia_Man_t * pFrames;

    // CEX minimization
    clk = Abc_Clock();
    pCexCare = Bmc_CexCareMinimizeAig( p, Gia_ManPiNum(p), pCex, 1, 1, 1 );
    for ( i = pCexCare->nRegs; i < pCexCare->nBits; i++ )
        Counter += Abc_InfoHasBit(pCexCare->pData, i);
    Abc_CexFree( pCexCare );
    printf( "Care bits = %d. ", Counter );
    Abc_PrintTime( 1, "CEX minimization", Abc_Clock() - clk );

    // SAT instance
    clk = Abc_Clock();
    pFrames = Gia_ManFramesForCexMin( p, pCex->iFrame + 1 );
    pCnf = (Cnf_Dat_t*)Mf_ManGenerateCnf( pFrames, 8, 0, 0, 0, 0 );
    iFirstVar = pCnf->nVars - (pCex->iFrame+1) * pCex->nPis;
    pSat = (sat_solver*)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    iLit = Abc_Var2Lit( 1, 1 );
    status = sat_solver_addclause( pSat, &iLit, &iLit + 1 );
    assert( status );
    // create literals
    vLits = Vec_IntAlloc( 100 );
    for ( i = pCex->nRegs; i < pCex->nBits; i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(iFirstVar + i - pCex->nRegs, !Abc_InfoHasBit(pCex->pData, i)) );
    Abc_PrintTime( 1, "SAT solver", Abc_Clock() - clk );

    for ( n = 0; n < 2; n++ )
    {
        if ( n ) Vec_IntReverseOrder( vLits );

        // SAT-based minimization
        clk = Abc_Clock();
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), 0, 0, 0, 0 );
        nFinal = sat_solver_final( pSat, &pFinal );
        printf( "Status %d.  Selected %d assumptions out of %d.  ", status, nFinal, Vec_IntSize(vLits) );
        Abc_PrintTime( 1, "Analyze_final", Abc_Clock() - clk );

        // SAT-based minimization
        clk = Abc_Clock();
        nFinal = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vLits), Vec_IntSize(vLits), 0 );
        printf( "Status %d.  Selected %d assumptions out of %d.  ", status, nFinal, Vec_IntSize(vLits) );
        Abc_PrintTime( 1, "LEXUNSAT", Abc_Clock() - clk );
    }

    // cleanup
    Vec_IntFree( vLits );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pFrames );
}